

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

void read1_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  long lVar3;
  int iVar4;
  undefined8 in_R9;
  uv_buf_t uStack_98;
  code *pcStack_88;
  sockaddr_in sStack_80;
  uv_connect_t uStack_70;
  
  if (tcp == (uv_stream_t *)0x0) {
LAB_00171145:
    read1_cb_cold_3();
  }
  else {
    if (-1 < nread) {
      if (nread != 0) {
        lVar3 = 0;
        do {
          if (buf->base[lVar3] != 'P') {
            read1_cb_cold_2();
            goto LAB_00171145;
          }
          lVar3 = lVar3 + 1;
        } while (nread != lVar3);
      }
      return;
    }
    if (nread == -0xfff) {
      puts("GOT EOF");
      uv_close((uv_handle_t *)tcp,close_cb);
      return;
    }
  }
  read1_cb_cold_1();
  iVar4 = 0x23a3;
  pcStack_88 = (code *)0x171169;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_80);
  if (iVar1 == 0) {
    pcStack_88 = (code *)0x171176;
    puVar2 = uv_default_loop();
    iVar4 = 0x347938;
    pcStack_88 = (code *)0x171185;
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    if (iVar1 != 0) goto LAB_00171218;
    pcStack_88 = (code *)0x171192;
    puVar2 = uv_default_loop();
    iVar4 = 0x3479d0;
    pcStack_88 = (code *)0x1711a1;
    iVar1 = uv_tcp_init(puVar2,&tcp_handle);
    if (iVar1 != 0) goto LAB_0017121d;
    iVar4 = 0x3479d0;
    pcStack_88 = (code *)0x1711c0;
    iVar1 = uv_tcp_connect(&uStack_70,&tcp_handle,(sockaddr *)&sStack_80,connect_cb);
    if (iVar1 != 0) goto LAB_00171222;
    pcStack_88 = (code *)0x1711c9;
    puVar2 = uv_default_loop();
    iVar4 = 0;
    pcStack_88 = (code *)0x1711d3;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00171227;
    pcStack_88 = (code *)0x1711dc;
    puVar2 = uv_default_loop();
    pcStack_88 = (code *)0x1711f0;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    iVar4 = 0;
    pcStack_88 = (code *)0x1711fa;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStack_88 = (code *)0x1711ff;
    puVar2 = uv_default_loop();
    pcStack_88 = (code *)0x171207;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_88 = (code *)0x171218;
    run_test_tcp_read_stop_cold_1();
LAB_00171218:
    pcStack_88 = (code *)0x17121d;
    run_test_tcp_read_stop_cold_2();
LAB_0017121d:
    pcStack_88 = (code *)0x171222;
    run_test_tcp_read_stop_cold_3();
LAB_00171222:
    pcStack_88 = (code *)0x171227;
    run_test_tcp_read_stop_cold_4();
LAB_00171227:
    pcStack_88 = (code *)0x17122c;
    run_test_tcp_read_stop_cold_5();
  }
  pcStack_88 = connect_cb;
  run_test_tcp_read_stop_cold_6();
  if (iVar4 == 0) {
    uStack_98.len = 0x171250;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 == 0) {
      uStack_98.len = 0x17126a;
      iVar1 = uv_read_start((uv_stream_t *)&tcp_handle,fail_cb,fail_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0017127a;
    }
  }
  else {
    uStack_98.len = 0x171275;
    connect_cb_cold_1();
  }
  uStack_98.len = 0x17127a;
  connect_cb_cold_2();
LAB_0017127a:
  uStack_98.len = (size_t)timer_cb;
  connect_cb_cold_3();
  uStack_98 = uv_buf_init("PING",4);
  iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_handle,&uStack_98,1,write_cb);
  if (iVar1 == 0) {
    iVar1 = uv_read_stop((uv_stream_t *)&tcp_handle);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-read-stop.c"
          ,0x1f,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void read1_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  int i;
  ASSERT(tcp != NULL);

  if (nread >= 0) {
    for (i = 0; i < nread; ++i)
      ASSERT(buf->base[i] == 'P');
  } else {
    ASSERT(nread == UV_EOF);
    printf("GOT EOF\n");
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}